

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O1

void __thiscall duckdb::CTableInitData::~CTableInitData(CTableInitData *this)

{
  if ((this->init_data != (void *)0x0) && (this->delete_callback != (duckdb_delete_callback_t)0x0))
  {
    (*this->delete_callback)(this->init_data);
  }
  this->init_data = (void *)0x0;
  this->delete_callback = (duckdb_delete_callback_t)0x0;
  return;
}

Assistant:

~CTableInitData() {
		if (init_data && delete_callback) {
			delete_callback(init_data);
		}
		init_data = nullptr;
		delete_callback = nullptr;
	}